

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O2

int verify_fits(char *infile,FILE *out)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  long lVar7;
  FILE *infits_00;
  char *__s;
  int local_558;
  int hdutype;
  fitsfile *infits;
  char xtension [80];
  FitsHdu fitshdu;
  char rootnam [1025];
  
  memset(rootnam,0,0x401);
  local_558 = 0;
  ppuVar5 = __ctype_b_loc();
  __s = infile + -1;
  do {
    pcVar1 = __s + 1;
    __s = __s + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
  sVar6 = strlen(__s);
  lVar7 = (long)((int)sVar6 + -1);
  while ((-1 < (int)lVar7 && ((*(byte *)((long)*ppuVar5 + (long)__s[lVar7] * 2 + 1) & 0x20) != 0)))
  {
    __s[lVar7] = '\0';
    lVar7 = lVar7 + -1;
  }
  if (*__s != '\0') {
    wrtout(out," ");
    sprintf(comm,"File: %s",__s);
    wrtout(out,comm);
    totalhdu = 0;
    iVar2 = ffdkopn(&infits,__s,0,&local_558);
    if ((iVar2 == 0) && (iVar2 = ffthdu(infits,&totalhdu,&local_558), iVar2 == 0)) {
      init_report(out,rootnam);
      for (iVar2 = 1; iVar2 <= totalhdu; iVar2 = iVar2 + 1) {
        hdutype = -1;
        iVar3 = ffmahd(infits,iVar2,&hdutype,&local_558);
        if (iVar3 != 0) {
          print_title(out,iVar2,hdutype);
          wrtferr(out,"",&local_558,2);
          set_hdubasic(iVar2,hdutype);
          break;
        }
        iVar3 = hdutype;
        if (hdutype == 0 && iVar2 != 1) {
          ffgky(infits,0x10,"XTENSION",xtension,0,&local_558);
          iVar4 = bcmp(xtension,"BINTABLE",9);
          iVar3 = 2;
          if (iVar4 != 0) {
            iVar3 = hdutype;
          }
        }
        print_title(out,iVar2,iVar3);
        init_hdu(infits,out,iVar2,hdutype,&fitshdu);
        test_hdu(infits,out,&fitshdu);
        if (testdata != 0) {
          test_data(infits,out,&fitshdu);
        }
        infits_00 = out;
        close_err(out);
        if (prhead != 0) {
          infits_00 = out;
          print_header(out);
        }
        if (prstat != 0) {
          print_summary((fitsfile *)infits_00,out,&fitshdu);
        }
        close_hdu(&fitshdu);
      }
      test_end(infits,out);
      close_report(out);
      ffclos(infits,&local_558);
    }
    else {
      wrtserr(out,"",&local_558,2);
      leave_early(out);
      local_558 = 1;
    }
  }
  return local_558;
}

Assistant:

int verify_fits(char *infile, FILE *out)
{
    char rootnam[FLEN_FILENAME] = "";   /* Input Fits file root name */
    fitsfile *infits;                   /* input fits file pointer */
    FitsHdu fitshdu;                    /* hdu information */
    int hdutype;
    int status = 0;
    int i;
    int len;
    char *p;
    char *pfile;
    char xtension[80];

    /* take out the leading and trailing space and skip the empty line*/
    p = infile;
    while(isspace((int)*p) )p++;
    len = strlen(p);
    pfile = p;
    p += (len -1);
    for (i = len - 1; i >= 0 && isspace((int)*p); i--) {*p = '\0'; p--;}
    if(!strlen(pfile)) return status;

#ifndef WEBTOOL
    wrtout(out," ");
    sprintf(comm,"File: %s",pfile);
    wrtout(out,comm);
#endif

    totalhdu = 0;

#ifndef STANDALONE
    /* discard the extension, rowfilter... */
    if(ffrtnm(pfile, rootnam, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    if(fits_open_file(&infits, rootnam, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#else
    if(fits_open_diskfile(&infits, pfile, READONLY, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }
#endif

    /* get the total hdus */
    if(fits_get_num_hdus(infits, &totalhdu, &status)) {
        wrtserr(out,"",&status,2);
        leave_early(out);
        status = 1;
        return status;
    }

    /* initialize the report */
    init_report(out,rootnam);
    /*------------------  Hdu Loop --------------------------------*/
    for (i = 1; i <= totalhdu; i++) {
        /* move to the right hdu and do the CFITSIO test */
        hdutype = -1;
        if(fits_movabs_hdu(infits,i, &hdutype, &status) ) {
            print_title(out,i, hdutype);
            wrtferr(out,"",&status,2);
            set_hdubasic(i,hdutype);
            break;
        }

        if (i != 1 && hdutype == IMAGE_HDU) {
           /* test if this is a tile compressed image in a binary table */
           fits_read_key(infits, TSTRING, "XTENSION", xtension, NULL, &status);
           if (!strcmp(xtension, "BINTABLE") )
               print_title(out,i, BINARY_TBL);
	   else
	       print_title(out,i, hdutype);
        }  
        else
               print_title(out,i, hdutype);

        init_hdu(infits,out,i,hdutype,
            &fitshdu);                          /* initialize fitshdu  */

        test_hdu(infits,out,&fitshdu);          /* test hdu header */

        if(testdata)
            test_data(infits,out,&fitshdu);

        close_err(out);                         /* end of error report */

        if(prhead)
            print_header(out);
        if(prstat)
            print_summary(infits,out,&fitshdu);
        close_hdu(&fitshdu);                    /* clear the fitshdu  */
    }
    /* test the end of file  */
    test_end(infits,out);

    /*------------------ Closing  --------------------------------*/
    /* closing the report*/
    close_report(out);

    /* close the input fitsfile  */
    fits_close_file(infits, &status);

    return status;
}